

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O2

void __thiscall FConfigFile::FConfigFile(FConfigFile *this,FConfigFile *other)

{
  this->_vptr_FConfigFile = (_func_int **)&PTR__FConfigFile_007c6890;
  (this->PathName).Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  this->CurrentSection = (FConfigSection *)0x0;
  this->CurrentEntry = (FConfigEntry *)0x0;
  this->Sections = (FConfigSection *)0x0;
  this->LastSectionPtr = &this->Sections;
  FString::operator=(&this->PathName,(other->PathName).Chars);
  operator=(this,other);
  this->OkayToWrite = other->OkayToWrite;
  this->FileExisted = other->FileExisted;
  return;
}

Assistant:

FConfigFile::FConfigFile (const FConfigFile &other)
{
	Sections = CurrentSection = NULL;
	LastSectionPtr = &Sections;
	CurrentEntry = NULL;
	ChangePathName (other.PathName);
	*this = other;
	OkayToWrite = other.OkayToWrite;
	FileExisted = other.FileExisted;
}